

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O0

int Aig_ObjWhatFanin(Aig_Obj_t *pObj,Aig_Obj_t *pFanin)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pFanin_local;
  Aig_Obj_t *pObj_local;
  
  pAVar1 = Aig_ObjFanin0(pObj);
  if (pAVar1 == pFanin) {
    pObj_local._4_4_ = 0;
  }
  else {
    pAVar1 = Aig_ObjFanin1(pObj);
    if (pAVar1 != pFanin) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                    ,0x150,"int Aig_ObjWhatFanin(Aig_Obj_t *, Aig_Obj_t *)");
    }
    pObj_local._4_4_ = 1;
  }
  return pObj_local._4_4_;
}

Assistant:

static inline int          Aig_ObjWhatFanin( Aig_Obj_t * pObj, Aig_Obj_t * pFanin )    
{ 
    if ( Aig_ObjFanin0(pObj) == pFanin ) return 0; 
    if ( Aig_ObjFanin1(pObj) == pFanin ) return 1; 
    assert(0); return -1; 
}